

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_interpreter_applyClosureASTFunction
          (sysbvm_context_t *context,sysbvm_tuple_t function_,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  ulong uVar1;
  int iVar2;
  sysbvm_tuple_t sVar3;
  size_t sVar4;
  sysbvm_tuple_t returnTarget;
  anon_struct_24_3_c95f86a5 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameFunctionActivationRecord_t functionActivationRecord;
  long local_1a8;
  sysbvm_tuple_t local_1a0;
  sysbvm_tuple_t local_198;
  sysbvm_tuple_t local_190;
  sysbvm_tuple_t *local_188;
  sysbvm_stackFrameRecord_t local_180;
  undefined8 local_170;
  sysbvm_stackFrameRecord_t local_168;
  undefined8 local_158;
  undefined1 *local_150;
  sysbvm_stackFrameRecord_t local_140;
  undefined8 local_130;
  sysbvm_stackFrameRecord_t local_128;
  sysbvm_tuple_t local_118;
  sysbvm_functionDefinition_t *local_110;
  sysbvm_tuple_t local_108;
  sysbvm_tuple_t local_100;
  __jmp_buf_tag local_f8;
  
  local_188 = arguments;
  memset(&local_128,0,0xf8);
  local_128.type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION;
  local_118 = function_;
  sysbvm_stackFrame_pushRecord(&local_128);
  local_110 = *(sysbvm_functionDefinition_t **)(local_118 + 0x48);
  sVar3 = local_110->sourceAnalyzedDefinition;
  local_140.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_140.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_130 = *(undefined8 *)(sVar3 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_140);
  sysbvm_functionDefinition_ensureAnalysis(context,&local_110);
  uVar1 = *(ulong *)(sVar3 + 0x38);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    sVar4 = (size_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  else {
    sVar4 = 0;
  }
  local_190 = sVar3;
  if (sVar4 != argumentCount) {
    sysbvm_error_argumentCountMismatch(sVar4,argumentCount);
  }
  sVar3 = sysbvm_functionActivationEnvironment_create(context,0,local_118);
  local_108 = sVar3;
  if ((ulong)&stack0x07fffffffffffed8 >> 0x3c == 0) {
    returnTarget = (long)&local_128 * 0x10 | 0xb;
  }
  else {
    returnTarget = sysbvm_tuple_uint64_encodeBig(context,(uint64_t)&local_128);
  }
  sysbvm_analysisAndEvaluationEnvironment_setReturnTarget(context,sVar3,returnTarget);
  if ((applicationFlags & 1) == 0) {
    if (argumentCount != 0) {
      sVar4 = 0;
      do {
        local_1a8 = 0;
        uVar1 = *(ulong *)(local_190 + 0x38);
        if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
          local_1a8 = *(long *)(uVar1 + 0x10 + sVar4 * 8);
        }
        local_198 = local_188[sVar4];
        local_1a0 = 0;
        local_168.previous = (sysbvm_stackFrameRecord_s *)0x0;
        local_168.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
        local_168._12_4_ = 0;
        local_158 = 3;
        local_150 = (undefined1 *)&local_1a8;
        sysbvm_stackFrame_pushRecord(&local_168);
        local_180.previous = (sysbvm_stackFrameRecord_s *)0x0;
        local_180.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
        local_170 = *(undefined8 *)(local_1a8 + 0x10);
        sysbvm_stackFrame_pushRecord(&local_180);
        if ((*(sysbvm_tuple_t *)(local_1a8 + 0x38) != 0) &&
           (local_1a0 = sysbvm_interpreter_evaluateASTWithEnvironment
                                  (context,*(sysbvm_tuple_t *)(local_1a8 + 0x38),local_108),
           local_1a0 != 0)) {
          local_198 = sysbvm_type_coerceValue(context,local_1a0,local_198);
        }
        uVar1 = *(ulong *)(local_108 + 0xa0);
        if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
          *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar4 * 8) = local_198;
        }
        sysbvm_stackFrame_popRecord(&local_180);
        sysbvm_stackFrame_popRecord(&local_168);
        sVar4 = sVar4 + 1;
      } while (argumentCount != sVar4);
    }
  }
  else if (argumentCount != 0) {
    sVar4 = 0;
    do {
      uVar1 = *(ulong *)(local_108 + 0xa0);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar4 * 8) = local_188[sVar4];
      }
      sVar4 = sVar4 + 1;
    } while (argumentCount != sVar4);
  }
  iVar2 = _setjmp(&local_f8);
  if (iVar2 == 0) {
    sysbvm_gc_safepoint(context);
    local_100 = sysbvm_interpreter_evaluateASTWithEnvironment
                          (context,*(sysbvm_tuple_t *)(local_190 + 0x48),local_108);
  }
  sysbvm_gc_safepoint(context);
  sysbvm_stackFrame_popRecord(&local_140);
  sysbvm_stackFrame_popRecord(&local_128);
  return local_100;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_applyClosureASTFunction(sysbvm_context_t *context, sysbvm_tuple_t function_, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    sysbvm_stackFrameFunctionActivationRecord_t functionActivationRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION,
        .function = function_,
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&functionActivationRecord);  
    sysbvm_function_t **closure = (sysbvm_function_t**)&functionActivationRecord.function;

    functionActivationRecord.functionDefinition = (*closure)->definition;
    sysbvm_functionDefinition_t **functionDefinition = (sysbvm_functionDefinition_t**)&functionActivationRecord.functionDefinition;

    sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t*)(*functionDefinition)->sourceAnalyzedDefinition;

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, sourceAnalyzedDefinition->sourcePosition);
    sysbvm_functionDefinition_ensureAnalysis(context, functionDefinition);

    size_t expectedArgumentCount = sysbvm_array_getSize(sourceAnalyzedDefinition->argumentNodes);
    if(argumentCount != expectedArgumentCount)
        sysbvm_error_argumentCountMismatch(expectedArgumentCount, argumentCount);
    functionActivationRecord.applicationEnvironment = sysbvm_functionActivationEnvironment_create(context, SYSBVM_NULL_TUPLE, functionActivationRecord.function);
    sysbvm_analysisAndEvaluationEnvironment_setReturnTarget(context, functionActivationRecord.applicationEnvironment, sysbvm_tuple_uintptr_encode(context, (uintptr_t)&functionActivationRecord));

    bool isNoTypecheck = (applicationFlags & SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK) != 0;
    if(isNoTypecheck)
    {
        // Avoid the coercion here.
        for(size_t i = 0; i < argumentCount; ++i)
            sysbvm_interpreter_bindArgumentNodeValueInEnvironment(context, i, &functionActivationRecord.applicationEnvironment, arguments[i]);
    }
    else
    {
        // FIXME: Add support for the forall arguments here.
        for(size_t i = 0; i < argumentCount; ++i)
            sysbvm_interpreter_evaluateArgumentNodeInEnvironment(context, i, sysbvm_array_at(sourceAnalyzedDefinition->argumentNodes, i), &functionActivationRecord.applicationEnvironment, &arguments[i]);
    }

    // Use setjmp for implementing the #return: statement.
    if(!_setjmp(functionActivationRecord.jmpbuffer))
    {
        sysbvm_gc_safepoint(context);
        functionActivationRecord.result = sysbvm_interpreter_evaluateASTWithEnvironment(context, sourceAnalyzedDefinition->bodyNode, functionActivationRecord.applicationEnvironment);
    }

    sysbvm_gc_safepoint(context);
    
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&functionActivationRecord);  
    return functionActivationRecord.result;
}